

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86_fma::create_pipeline_fp16s(InnerProduct_x86_fma *this,Option *opt)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  long *plVar4;
  undefined8 *puVar5;
  byte *in_RSI;
  long *in_RDI;
  int num_input;
  Option *in_stack_000005e0;
  int in_stack_000005e8;
  int in_stack_000005ec;
  Mat *in_stack_000005f0;
  Mat *in_stack_000005f8;
  
  innerproduct_transform_kernel_fp16s_sse
            (in_stack_000005f8,in_stack_000005f0,in_stack_000005ec,in_stack_000005e8,
             in_stack_000005e0);
  if ((*in_RSI & 1) != 0) {
    lVar2 = *(long *)(*in_RDI + -0x18);
    puVar5 = (undefined8 *)((long)in_RDI + lVar2 + 0x130);
    if (*(long *)((long)in_RDI + lVar2 + 0x138) != 0) {
      piVar3 = *(int **)((long)in_RDI + lVar2 + 0x138);
      LOCK();
      iVar1 = *piVar3;
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (*(long *)((long)in_RDI + lVar2 + 0x150) == 0) {
          if ((void *)*puVar5 != (void *)0x0) {
            free((void *)*puVar5);
          }
        }
        else {
          plVar4 = *(long **)((long)in_RDI + lVar2 + 0x150);
          (**(code **)(*plVar4 + 0x18))(plVar4,*puVar5);
        }
      }
    }
    *puVar5 = 0;
    *(undefined8 *)((long)in_RDI + lVar2 + 0x140) = 0;
    *(undefined4 *)((long)in_RDI + lVar2 + 0x148) = 0;
    *(undefined4 *)((long)in_RDI + lVar2 + 0x158) = 0;
    *(undefined4 *)((long)in_RDI + lVar2 + 0x15c) = 0;
    *(undefined4 *)((long)in_RDI + lVar2 + 0x160) = 0;
    *(undefined4 *)((long)in_RDI + lVar2 + 0x164) = 0;
    *(undefined4 *)((long)in_RDI + lVar2 + 0x168) = 0;
    *(undefined8 *)((long)in_RDI + lVar2 + 0x170) = 0;
    *(undefined8 *)((long)in_RDI + lVar2 + 0x138) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_fma::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}